

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

void set_date_time(uchar *p,time_t t)

{
  undefined1 local_50 [8];
  tm_conflict tm;
  time_t t_local;
  uchar *p_local;
  
  tm.tm_zone = (char *)t;
  get_tmfromtime((tm_conflict *)local_50,(time_t *)&tm.tm_zone);
  set_digit(p,4,tm.tm_mday + 0x76c);
  set_digit(p + 4,2,tm.tm_hour + 1);
  set_digit(p + 6,2,tm.tm_min);
  set_digit(p + 8,2,tm.tm_sec);
  set_digit(p + 10,2,local_50._4_4_);
  set_digit(p + 0xc,2,local_50._0_4_);
  set_digit(p + 0xe,2,0);
  set_num_712(p + 0x10,(char)((long)tm._32_8_ / 900));
  return;
}

Assistant:

static void
set_date_time(unsigned char *p, time_t t)
{
	struct tm tm;

	get_tmfromtime(&tm, &t);
	set_digit(p, 4, tm.tm_year + 1900);
	set_digit(p+4, 2, tm.tm_mon + 1);
	set_digit(p+6, 2, tm.tm_mday);
	set_digit(p+8, 2, tm.tm_hour);
	set_digit(p+10, 2, tm.tm_min);
	set_digit(p+12, 2, tm.tm_sec);
	set_digit(p+14, 2, 0);
	set_num_712(p+16, (char)(get_gmoffset(&tm)/(60*15)));
}